

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-htable.c
# Opt level: O0

ulong hash_func(char *param_1)

{
  uint32_t fnv1a;
  uint8_t *ptr;
  VAL *val;
  HTABLE_NODE *node_local;
  
  ptr = *(uint8_t **)(param_1 + 8);
  fnv1a = 0;
  for (; *ptr != '\0'; ptr = ptr + 1) {
    fnv1a = (*ptr ^ fnv1a) * 0x1000193;
  }
  return (ulong)fnv1a;
}

Assistant:

static uint32_t
hash_func(const HTABLE_NODE* node)
{
    /* FNV-1a */
    static const uint32_t FNV1A_PRIME_32 = 16777619;
    VAL* val = (VAL*) HTABLE_DATA(node, VAL, the_node);
    const uint8_t* ptr = (const uint8_t*) val->key;
    uint32_t fnv1a = 0;

    while(*ptr) {
        fnv1a ^= *ptr;
        fnv1a *= FNV1A_PRIME_32;
        ptr++;
    }

    return fnv1a;
}